

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O1

void __thiscall
moira::StrWriter::briefExtension<(moira::Mode)6,(moira::Size)2>
          (StrWriter *this,Ea<(moira::Mode)6,_(moira::Size)2> *ea)

{
  char *pcVar1;
  byte *pbVar2;
  u16 uVar3;
  char cVar4;
  long lVar5;
  uint uVar6;
  byte bVar7;
  uint uVar8;
  
  uVar6 = ea->ext1;
  pcVar1 = this->ptr;
  this->ptr = pcVar1 + 1;
  *pcVar1 = '(';
  if ((char)uVar6 != '\0') {
    operator<<(this,(Int)(int)(char)uVar6);
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = ',';
  }
  uVar3 = ea->reg;
  pcVar1 = this->ptr;
  this->ptr = pcVar1 + 1;
  *pcVar1 = 'A';
  pcVar1 = this->ptr;
  this->ptr = pcVar1 + 1;
  *pcVar1 = (char)uVar3 + '0';
  pcVar1 = this->ptr;
  this->ptr = pcVar1 + 1;
  *pcVar1 = ',';
  uVar8 = uVar6 >> 0xc & 0xf;
  pcVar1 = this->ptr;
  this->ptr = pcVar1 + 1;
  bVar7 = (byte)uVar8;
  if (uVar8 < 8) {
    *pcVar1 = 'D';
    bVar7 = bVar7 | 0x30;
  }
  else {
    *pcVar1 = 'A';
    bVar7 = bVar7 + 0x28;
  }
  pbVar2 = (byte *)this->ptr;
  this->ptr = (char *)(pbVar2 + 1);
  *pbVar2 = bVar7;
  if ((uVar6 >> 0xb & 1) == 0) {
    if (this->upper == false) {
      cVar4 = '.';
      lVar5 = 0;
      do {
        pcVar1 = this->ptr;
        this->ptr = pcVar1 + 1;
        *pcVar1 = cVar4;
        cVar4 = ".w"[lVar5 + 1];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 2);
    }
    else {
      cVar4 = '.';
      lVar5 = 0;
      do {
        pcVar1 = this->ptr;
        this->ptr = pcVar1 + 1;
        *pcVar1 = cVar4;
        cVar4 = ".W"[lVar5 + 1];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 2);
    }
  }
  else if (this->upper == false) {
    cVar4 = '.';
    lVar5 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar4;
      cVar4 = ".l"[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 2);
  }
  else {
    cVar4 = '.';
    lVar5 = 0;
    do {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = cVar4;
      cVar4 = ".L"[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 2);
  }
  uVar6 = uVar6 >> 9 & 3;
  if (uVar6 != 0) {
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = '*';
    pbVar2 = (byte *)this->ptr;
    this->ptr = (char *)(pbVar2 + 1);
    *pbVar2 = (byte)(1 << (sbyte)uVar6) | 0x30;
  }
  pcVar1 = this->ptr;
  this->ptr = pcVar1 + 1;
  *pcVar1 = ')';
  return;
}

Assistant:

void
StrWriter::briefExtension(const Ea<M,S> &ea)
{
    assert(M == 6 || M == 10);

    //   15 - 12    11   10   09   08   07   06   05   04   03   02   01   00
    // -----------------------------------------------------------------------
    // | REGISTER | LW | SCALE   | 0  | DISPLACEMENT                         |
    // -----------------------------------------------------------------------

    u16 reg   = xxxx____________ (ea.ext1);
    u16 lw    = ____x___________ (ea.ext1);
    u16 scale = _____xx_________ (ea.ext1);
    u16 disp  = ________xxxxxxxx (ea.ext1);

    *this << "(";
    if (disp) *this << Int{(i8)disp} << ",";
    M == 10 ? *this << "PC" : *this << An{ea.reg};
    *this << "," << Rn{reg};
    lw ? *this << Sz<Long>{} : *this << Sz<Word>{};
    *this << Scale{scale} << ")";
}